

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespaceEnumerator.cpp
# Opt level: O2

void __thiscall Js::ModuleNamespaceEnumerator::Reset(ModuleNamespaceEnumerator *this)

{
  this->currentLocalMapIndex = -1;
  this->currentNonLocalMapIndex = -1;
  this->doneWithExports = false;
  this->doneWithSymbol = (this->flags & EnumSymbols) == None;
  JavascriptStaticEnumerator::Reset(&this->symbolEnumerator);
  return;
}

Assistant:

void ModuleNamespaceEnumerator::Reset()
    {
        currentLocalMapIndex = Constants::NoBigSlot;
        currentNonLocalMapIndex = Constants::NoBigSlot;
        doneWithExports = false;
        if (!!(flags & EnumeratorFlags::EnumSymbols))
        {
            doneWithSymbol = false;
        }
        else
        {
            doneWithSymbol = true;
        }
        symbolEnumerator.Reset();
    }